

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemUtils.cpp
# Opt level: O0

string * ApprovalTests::SystemUtils::checkFilenameCase(string *fullPath)

{
  bool bVar1;
  string *in_RSI;
  string *in_RDI;
  string *in_stack_00000060;
  
  bVar1 = isWindowsOs();
  if ((bVar1) && (bVar1 = FileUtils::fileExists(in_stack_00000060), bVar1)) {
    ::std::__cxx11::string::string((string *)in_RDI,in_RSI);
  }
  else {
    ::std::__cxx11::string::string((string *)in_RDI,in_RSI);
  }
  return in_RDI;
}

Assistant:

std::string SystemUtils::checkFilenameCase(const std::string& fullPath)
    {
        if (!isWindowsOs() || !FileUtils::fileExists(fullPath))
        {
            return fullPath;
        }
#ifdef _WIN32

        _finddata_t findFileData;
        auto hFind = _findfirst(fullPath.c_str(), &findFileData);

        if (hFind != -1)
        {
            const std::string fixedFilename = findFileData.name;
            const std::string fixedPath = StringUtils::replaceAll(
                fullPath, StringUtils::toLower(fixedFilename), fixedFilename);
            _findclose(hFind);
            return fixedPath;
        }

#endif
        return fullPath;
    }